

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
                 *handler)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_30;
  precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
  local_28;
  
  pcVar2 = begin + 1;
  local_30 = pcVar2;
  if (pcVar2 == end) {
LAB_0011e6b4:
    dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
    ::on_error(&handler->
                super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
               ,"missing precision specifier");
    return pcVar2;
  }
  if ((int)*pcVar2 - 0x30U < 10) {
    iVar1 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                      (&local_30,end,handler);
    ((handler->
     super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
     ).super_specs_setter<char>.specs_)->precision = iVar1;
  }
  else {
    if (*pcVar2 != '{') goto LAB_0011e6b4;
    pcVar2 = begin + 2;
    if (pcVar2 != end) {
      local_28.handler = handler;
      pcVar2 = parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>>
                         (pcVar2,end,&local_28);
    }
    pcVar3 = pcVar2;
    if ((pcVar2 == end) || (pcVar3 = pcVar2 + 1, local_30 = pcVar3, *pcVar2 != '}')) {
      dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
      ::on_error(&handler->
                  super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
                 ,"invalid format string");
      return pcVar3;
    }
  }
  numeric_specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
  ::check_precision(&handler->checker_);
  return local_30;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}